

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineReturn
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn,Instruction *inst,
          uint32_t returnVarId)

{
  uint **ppuVar1;
  Instruction *pIVar2;
  IRContext *this_00;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  uint32_t uVar6;
  Operand *pOVar7;
  uint **ppuVar8;
  const_iterator cVar9;
  _func_int **pp_Var10;
  Instruction *line_inst;
  long *plVar11;
  undefined4 in_stack_00000014;
  uint32_t in_stack_00000018;
  string message;
  spv_position_t local_68;
  DebugScope local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  if (*(int *)(CONCAT44(in_stack_00000014,returnVarId) + 0x28) == 0xfe) {
    if (in_stack_00000018 == 0) {
      __assert_fail("returnVarId != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp"
                    ,0x184,
                    "std::unique_ptr<BasicBlock> spvtools::opt::InlinePass::InlineReturn(const std::unordered_map<uint32_t, uint32_t> &, std::vector<std::unique_ptr<BasicBlock>> *, std::unique_ptr<BasicBlock>, analysis::DebugInlinedAtContext *, Function *, const Instruction *, uint32_t)"
                   );
    }
    pOVar7 = Instruction::GetInOperand((Instruction *)CONCAT44(in_stack_00000014,returnVarId),0);
    ppuVar1 = (uint **)(pOVar7->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar8 = &(pOVar7->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar8 = ppuVar1;
    }
    local_68.line = CONCAT44(local_68.line._4_4_,**ppuVar8);
    cVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)new_blocks,(key_type *)&local_68);
    if (cVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      uVar6 = (uint32_t)local_68.line;
    }
    else {
      local_68.line =
           CONCAT44(local_68.line._4_4_,
                    *(uint32_t *)
                     ((long)cVar9.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur + 0xc));
      uVar6 = *(uint32_t *)
               ((long)cVar9.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
    }
    pIVar2 = *(Instruction **)(CONCAT44(in_stack_00000014,returnVarId) + 0x50);
    line_inst = (Instruction *)0x0;
    if (pIVar2 != *(Instruction **)(CONCAT44(in_stack_00000014,returnVarId) + 0x58)) {
      line_inst = pIVar2;
    }
    this_00 = (IRContext *)(callee2caller->_M_h)._M_rehash_policy._M_next_resize;
    if ((this_00->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
      IRContext::BuildDebugInfoManager(this_00);
    }
    local_50 = analysis::DebugInfoManager::BuildDebugScope
                         ((this_00->debug_info_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                          ._M_head_impl,
                          (DebugScope *)(CONCAT44(in_stack_00000014,returnVarId) + 0x68),
                          (DebugInlinedAtContext *)calleeFn);
    AddStore((InlinePass *)callee2caller,in_stack_00000018,uVar6,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)inlined_at_ctx,line_inst,&stack0xffffffffffffffb0);
  }
  plVar11 = *(long **)&inst[1].opcode_;
  do {
    if (plVar11 == *(long **)&inst[1].unique_id_) {
LAB_005be786:
      (this->super_Pass)._vptr_Pass = (_func_int **)inlined_at_ctx->call_inst_line_;
      inlined_at_ctx->call_inst_line_ = (Instruction *)0x0;
      return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                )this;
    }
    lVar3 = *(long *)(*plVar11 + 0x20);
    if ((lVar3 == 0) || (*(char *)(lVar3 + 0x18) != '\0')) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    bVar5 = spvOpcodeIsAbort(*(Op *)(*(long *)(*plVar11 + 0x28) + 0x28));
    if (bVar5) {
      sVar4 = (callee2caller->_M_h)._M_rehash_policy._M_next_resize;
      uVar6 = Module::TakeNextIdBound(*(Module **)(sVar4 + 0x30));
      if ((uVar6 == 0) && (*(long *)(sVar4 + 0x48) != 0)) {
        local_68.line = 0x25;
        local_50 = (DebugScope)&stack0xffffffffffffffc0;
        local_50 = (DebugScope)
                   std::__cxx11::string::_M_create
                             ((ulong *)&stack0xffffffffffffffb0,(ulong)&local_68);
        local_40 = local_68.line;
        *(undefined8 *)local_50 = 0x667265766f204449;
        builtin_strncpy((char *)((long)local_50 + 8),"low. Try",8);
        builtin_strncpy((char *)((long)local_50 + 0x10)," running",8);
        builtin_strncpy((char *)((long)local_50 + 0x18)," compact",8);
        builtin_strncpy((char *)((long)local_50 + 0x1d),"act-ids.",8);
        local_48 = local_68.line;
        *(char *)((long)local_50 + local_68.line) = '\0';
        local_68.line = 0;
        local_68.column = 0;
        local_68.index = 0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                    *)(sVar4 + 0x38),SPV_MSG_ERROR,"",&local_68,(char *)local_50);
        if (local_50 != (DebugScope)&stack0xffffffffffffffc0) {
          operator_delete((void *)local_50,local_40 + 1);
        }
      }
      else if (uVar6 != 0) {
        if (*(int *)(CONCAT44(in_stack_00000014,returnVarId) + 0x28) - 0xfdU < 2) {
          AddBranch((InlinePass *)callee2caller,uVar6,
                    (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)inlined_at_ctx);
        }
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                  ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                    *)new_blk_ptr,
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)inlined_at_ctx);
        NewLabel((InlinePass *)&stack0xffffffffffffffb0,(uint32_t)callee2caller);
        pp_Var10 = (_func_int **)operator_new(0x88);
        *pp_Var10 = (_func_int *)0x0;
        *(DebugScope *)(pp_Var10 + 1) = local_50;
        pp_Var10[3] = (_func_int *)&PTR__Instruction_009309d8;
        *(undefined4 *)(pp_Var10 + 9) = 0;
        *(undefined8 *)((long)pp_Var10 + 0x3e) = 0;
        pp_Var10[7] = (_func_int *)0x0;
        pp_Var10[0x10] = (_func_int *)0x0;
        pp_Var10[0xe] = (_func_int *)0x0;
        pp_Var10[0xf] = (_func_int *)0x0;
        pp_Var10[0xc] = (_func_int *)0x0;
        pp_Var10[0xd] = (_func_int *)0x0;
        pp_Var10[10] = (_func_int *)0x0;
        pp_Var10[0xb] = (_func_int *)0x0;
        pp_Var10[4] = (_func_int *)(pp_Var10 + 3);
        pp_Var10[5] = (_func_int *)(pp_Var10 + 3);
        *(undefined1 *)(pp_Var10 + 6) = 1;
        pp_Var10[2] = (_func_int *)&PTR__InstructionList_00930a70;
        (this->super_Pass)._vptr_Pass = pp_Var10;
        return (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                )this;
      }
      goto LAB_005be786;
    }
    plVar11 = plVar11 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineReturn(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn,
    const Instruction* inst, uint32_t returnVarId) {
  // Store return value to return variable.
  if (inst->opcode() == spv::Op::OpReturnValue) {
    assert(returnVarId != 0);
    uint32_t valId = inst->GetInOperand(kSpvReturnValueId).words[0];
    const auto mapItr = callee2caller.find(valId);
    if (mapItr != callee2caller.end()) {
      valId = mapItr->second;
    }
    AddStore(returnVarId, valId, &new_blk_ptr, inst->dbg_line_inst(),
             context()->get_debug_info_mgr()->BuildDebugScope(
                 inst->GetDebugScope(), inlined_at_ctx));
  }

  uint32_t returnLabelId = 0;
  for (auto callee_block_itr = calleeFn->begin();
       callee_block_itr != calleeFn->end(); ++callee_block_itr) {
    if (spvOpcodeIsAbort(callee_block_itr->tail()->opcode())) {
      returnLabelId = context()->TakeNextId();
      break;
    }
  }
  if (returnLabelId == 0) return new_blk_ptr;

  if (inst->opcode() == spv::Op::OpReturn ||
      inst->opcode() == spv::Op::OpReturnValue)
    AddBranch(returnLabelId, &new_blk_ptr);
  new_blocks->push_back(std::move(new_blk_ptr));
  return MakeUnique<BasicBlock>(NewLabel(returnLabelId));
}